

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O0

int lws_service_fd_tsi(lws_context *context,pollfd *pollfd,int tsi)

{
  int iVar1;
  lws_ssl_capable_status lVar2;
  lws *plVar3;
  lws *wsi_00;
  size_t sVar4;
  lws_log_cx *plVar5;
  lws *wsi;
  lws_context_per_thread *pt;
  int tsi_local;
  pollfd *pollfd_local;
  lws_context *context_local;
  
  if ((context == (lws_context *)0x0) || ((*(ushort *)&context->field_0x7b7 >> 3 & 1) != 0)) {
    return -1;
  }
  plVar3 = (lws *)(context->pt + tsi);
  if (((byte)*(undefined1 *)((long)&(plVar3->sul_timeout).cb + 3) >> 4 & 1) != 0) {
    return -1;
  }
  if (pollfd == (pollfd *)0x0) {
    __assert_fail("pollfd",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core-net/service.c"
                  ,0x278,"int lws_service_fd_tsi(struct lws_context *, struct pollfd *, int)");
  }
  if (pollfd->fd == -1) {
    __assert_fail("lws_socket_is_valid(pollfd->fd)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core-net/service.c"
                  ,0x27b,"int lws_service_fd_tsi(struct lws_context *, struct pollfd *, int)");
  }
  wsi_00 = wsi_from_fd(context,pollfd->fd);
  if (wsi_00 == (lws *)0x0) {
    return 0;
  }
  if (((pollfd->revents & 0x18U) == 0x18) &&
     (*(ulong *)&wsi_00->field_0x46e = *(ulong *)&wsi_00->field_0x46e & 0xffffffffffffefff | 0x1000,
     (pollfd->revents & pollfd->events & 1U) == 0)) {
    sVar4 = lws_buflist_total_len(&wsi_00->buflist);
    if (sVar4 != 0) {
      lws_set_timeout(wsi_00,PENDING_TIMEOUT_CLOSE_ACK,3);
      goto LAB_001544ff;
    }
    plVar5 = lwsl_wsi_get_cx(wsi_00);
    _lws_log_cx(plVar5,lws_log_prepend_wsi,wsi_00,0x10,"lws_service_fd_tsi","Session Socket %d dead"
                ,pollfd->fd);
LAB_00154637:
    plVar5 = lwsl_wsi_get_cx(wsi_00);
    _lws_log_cx(plVar5,lws_log_prepend_wsi,wsi_00,0x10,"lws_service_fd_tsi","Close and handled");
    lws_close_free_wsi(wsi_00,LWS_CLOSE_STATUS_NOSTATUS,"close_and_handled");
    *(byte *)((long)&(plVar3->sul_timeout).cb + 3) =
         *(undefined1 *)((long)&(plVar3->sul_timeout).cb + 3) & 0xfd;
    context_local._4_4_ = 1;
  }
  else {
LAB_001544ff:
    if ((((wsi_00->wsistate & 0xffff) == 0x1f) && (iVar1 = lws_is_ssl(wsi_00), iVar1 != 0)) &&
       ((wsi_00->tls).ssl != (lws_tls_conn *)0x0)) {
      lVar2 = __lws_tls_shutdown(wsi_00);
      if (2 < (uint)(lVar2 + 4)) {
        if (lVar2 == LWS_SSL_CAPABLE_ERROR || lVar2 == LWS_SSL_CAPABLE_DONE) goto LAB_00154637;
        goto LAB_00154561;
      }
    }
    else {
LAB_00154561:
      *(ulong *)&wsi_00->field_0x46e = *(ulong *)&wsi_00->field_0x46e & 0xffffdfffffffffff;
      *(byte *)((long)&(plVar3->sul_timeout).cb + 3) =
           *(undefined1 *)((long)&(plVar3->sul_timeout).cb + 3) & 0xfd | 2;
      if (wsi_00->role_ops == (lws_role_ops *)0x0) {
        __assert_fail("wsi->role_ops",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core-net/service.c"
                      ,0x2cf,"int lws_service_fd_tsi(struct lws_context *, struct pollfd *, int)");
      }
      iVar1 = (*wsi_00->role_ops->rops_table[(ulong)(wsi_00->role_ops->rops_idx[2] & 0xf) - 1].
                check_upgrades)(plVar3);
      if (iVar1 == 4) {
        *(byte *)((long)&(plVar3->sul_timeout).cb + 3) =
             *(undefined1 *)((long)&(plVar3->sul_timeout).cb + 3) & 0xfd;
        return 1;
      }
      if (iVar1 != 5) {
        if (iVar1 != 6) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core-net/service.c"
                        ,0x2f5,"int lws_service_fd_tsi(struct lws_context *, struct pollfd *, int)")
          ;
        }
        goto LAB_00154637;
      }
    }
    pollfd->revents = 0;
    *(byte *)((long)&(plVar3->sul_timeout).cb + 3) =
         *(undefined1 *)((long)&(plVar3->sul_timeout).cb + 3) & 0xfd;
    context_local._4_4_ = 0;
  }
  return context_local._4_4_;
}

Assistant:

int
lws_service_fd_tsi(struct lws_context *context, struct lws_pollfd *pollfd,
		   int tsi)
{
	struct lws_context_per_thread *pt;
	struct lws *wsi;

	if (!context || context->service_no_longer_possible)
		return -1;

	pt = &context->pt[tsi];

	if (pt->event_loop_pt_unused)
		return -1;

	if (!pollfd) {
		/*
		 * calling with NULL pollfd for periodic background processing
		 * is no longer needed and is now illegal.
		 */
		assert(pollfd);
		return -1;
	}
	assert(lws_socket_is_valid(pollfd->fd));

	/* no, here to service a socket descriptor */
	wsi = wsi_from_fd(context, pollfd->fd);
	if (!wsi)
		/* not lws connection ... leave revents alone and return */
		return 0;

#if LWS_MAX_SMP > 1
	if (wsi->undergoing_init_from_other_pt)
		/*
		 * Temporary situation that other service thread is initializing
		 * this wsi right now for use on our service thread.
		 */
		return 0;
#endif

	/*
	 * so that caller can tell we handled, past here we need to
	 * zero down pollfd->revents after handling
	 */

	/*
	 * Whatever the situation with buffered rx packets, or explicitly read-
	 * and-buffered rx going to be handled before we want to acknowledge the
	 * socket is gone, any sign of HUP always immediately means no more tx
	 * is possible.
	 */

	if ((pollfd->revents & LWS_POLLHUP) == LWS_POLLHUP) {
		wsi->socket_is_permanently_unusable = 1;

		if (!(pollfd->revents & pollfd->events & LWS_POLLIN)) {

			/* ... there are no pending rx packets waiting... */

			if (!lws_buflist_total_len(&wsi->buflist)) {

				/*
				 * ... nothing stashed in the buflist either,
				 * so acknowledge the wsi is done
				 */

				lwsl_wsi_debug(wsi, "Session Socket %d dead",
						    pollfd->fd);

				goto close_and_handled;
			}

			/*
			 * ... in fact we have some unread rx buffered in the
			 * input buflist.  Hold off the closing a bit...
			 */

			lws_set_timeout(wsi, PENDING_TIMEOUT_CLOSE_ACK, 3);
		}
	}

#ifdef _WIN32
	if (pollfd->revents & LWS_POLLOUT)
		wsi->sock_send_blocking = FALSE;
#endif

#if defined(LWS_WITH_TLS)
	if (lwsi_state(wsi) == LRS_SHUTDOWN &&
	    lws_is_ssl(wsi) && wsi->tls.ssl) {
		switch (__lws_tls_shutdown(wsi)) {
		case LWS_SSL_CAPABLE_DONE:
		case LWS_SSL_CAPABLE_ERROR:
			goto close_and_handled;

		case LWS_SSL_CAPABLE_MORE_SERVICE_READ:
		case LWS_SSL_CAPABLE_MORE_SERVICE_WRITE:
		case LWS_SSL_CAPABLE_MORE_SERVICE:
			goto handled;
		}
	}
#endif
	wsi->could_have_pending = 0; /* clear back-to-back write detection */
	pt->inside_lws_service = 1;

	/* okay, what we came here to do... */

	/* if we got here, we should have wire protocol ops set on the wsi */
	assert(wsi->role_ops);

	// lwsl_notice("%s: %s: wsistate 0x%x\n", __func__, wsi->role_ops->name,
	//	    wsi->wsistate);

	switch (lws_rops_func_fidx(wsi->role_ops, LWS_ROPS_handle_POLLIN).
					       handle_POLLIN(pt, wsi, pollfd)) {
	case LWS_HPI_RET_WSI_ALREADY_DIED:
		pt->inside_lws_service = 0;
		return 1;
	case LWS_HPI_RET_HANDLED:
		break;
	case LWS_HPI_RET_PLEASE_CLOSE_ME:
		//lwsl_notice("%s: %s pollin says please close me\n", __func__,
		//		wsi->role_ops->name);
close_and_handled:
		lwsl_wsi_debug(wsi, "Close and handled");
		lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS,
				   "close_and_handled");
#if defined(_DEBUG) && defined(LWS_WITH_LIBUV)
		/*
		 * confirm close has no problem being called again while
		 * it waits for libuv service to complete the first async
		 * close
		 */
		if (!strcmp(context->event_loop_ops->name, "libuv"))
			lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS,
					   "close_and_handled uv repeat test");
#endif
		/*
		 * pollfd may point to something else after the close
		 * due to pollfd swapping scheme on delete on some platforms
		 * we can't clear revents now because it'd be the wrong guy's
		 * revents
		 */
		pt->inside_lws_service = 0;
		return 1;
	default:
		assert(0);
	}
#if defined(LWS_WITH_TLS)
handled:
#endif
	pollfd->revents = 0;
	pt->inside_lws_service = 0;

	return 0;
}